

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Ant * __thiscall
Ant::step(Ant *this,vector<Wall,_std::allocator<Wall>_> *walls,
         vector<Pheromone,_std::allocator<Pheromone>_> *pheromones,
         vector<Gate,_std::allocator<Gate>_> *gates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (double)((this->t).x - this->x);
  dVar4 = (double)((this->t).y - this->y);
  dVar4 = dVar4 * dVar4 + dVar5 * dVar5;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    updatePh(this,walls,pheromones,gates);
  }
  iVar2 = this->x;
  iVar3 = (this->t).x;
  if (iVar3 == iVar2) {
    iVar1 = (this->t).y;
    if (iVar1 == this->y) goto LAB_001068ae;
    iVar3 = (uint)(this->y <= iVar1) * 2 + 1;
LAB_001068d2:
    this->direction = iVar3;
  }
  else {
LAB_001068ae:
    if ((iVar3 != iVar2) && ((this->t).y == this->y)) {
      iVar3 = (uint)(iVar2 <= iVar3) * 2;
      goto LAB_001068d2;
    }
  }
  switch(this->direction) {
  case 0:
    iVar2 = iVar2 + -1;
    goto LAB_001068f2;
  case 1:
    this->y = this->y + -1;
    break;
  case 2:
    iVar2 = iVar2 + 1;
LAB_001068f2:
    this->x = iVar2;
    break;
  case 3:
    this->y = this->y + 1;
  }
  return this;
}

Assistant:

Ant& step(const vector<Wall> & walls, const vector<Pheromone> & pheromones, const vector<Gate> & gates) {
            if (dist({ t.x, t.y }, { x, y }) == 0)
                updatePh(walls, pheromones, gates);

            if (t.x == x && t.y != y && (direction != 1 || direction != 3))
                setFacing(t.y < y ? 1 : 3);
            else if (t.y == y && t.x != x && (direction != 0 || direction != 2))
                setFacing(t.x < x ? 0 : 2);

            switch(direction) {
                case 0:
                    x--;
                    break;
                case 1:
                    y--;
                    break;
                case 2:
                    x++;
                    break;
                case 3:
                    y++;
                    break;
                default:
                    break;
            }
            return *this;
        }